

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# levels.hpp
# Opt level: O3

char * websocketpp::log::alevel::channel_name(level channel)

{
  if ((int)channel < 0x80) {
    if ((int)channel < 0x10) {
      switch(channel) {
      case 1:
        return "connect";
      case 2:
        return "disconnect";
      case 4:
        return "control";
      case 8:
        return "frame_header";
      }
    }
    else {
      if (channel == 0x10) {
        return "frame_payload";
      }
      if (channel == 0x20) {
        return "message_header";
      }
      if (channel == 0x40) {
        return "message_payload";
      }
    }
  }
  else if ((int)channel < 0x400) {
    if (channel == 0x80) {
      return "endpoint";
    }
    if (channel == 0x100) {
      return "debug_handshake";
    }
    if (channel == 0x200) {
      return "debug_close";
    }
  }
  else if ((int)channel < 0x1000) {
    if (channel == 0x400) {
      return "devel";
    }
    if (channel == 0x800) {
      return "application";
    }
  }
  else {
    if (channel == 0x1000) {
      return "http";
    }
    if (channel == 0x2000) {
      return "fail";
    }
  }
  return "unknown";
}

Assistant:

static char const * channel_name(level channel) {
        switch(channel) {
            case connect:
                return "connect";
            case disconnect:
                return "disconnect";
            case control:
                return "control";
            case frame_header:
                return "frame_header";
            case frame_payload:
                return "frame_payload";
            case message_header:
                return "message_header";
            case message_payload:
                return "message_payload";
            case endpoint:
                return "endpoint";
            case debug_handshake:
                return "debug_handshake";
            case debug_close:
                return "debug_close";
            case devel:
                return "devel";
            case app:
                return "application";
            case http:
                return "http";
            case fail:
                return "fail";
            default:
                return "unknown";
        }
    }